

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stmt.h
# Opt level: O0

void __thiscall
enact::ImplStmt::ImplStmt
          (ImplStmt *this,
          unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *typename_,
          unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
          *traitTypename,
          vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
          *methods)

{
  vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
  *methods_local;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
  *traitTypename_local;
  unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *typename__local;
  ImplStmt *this_local;
  
  Stmt::Stmt(&this->super_Stmt);
  (this->super_Stmt)._vptr_Stmt = (_func_int **)&PTR__ImplStmt_0016a0f8;
  std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::unique_ptr
            (&this->typename_,typename_);
  std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>::unique_ptr
            (&this->traitTypename,traitTypename);
  std::
  vector<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>,_std::allocator<std::unique_ptr<enact::FunctionStmt,_std::default_delete<enact::FunctionStmt>_>_>_>
  ::vector(&this->methods,methods);
  return;
}

Assistant:

ImplStmt(std::unique_ptr<const Typename> typename_,
                std::unique_ptr<const Typename> traitTypename,
                std::vector<std::unique_ptr<FunctionStmt>> methods) :
                typename_{std::move(typename_)},
                traitTypename{std::move(traitTypename)},
                methods{std::move(methods)} {}